

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_from_curvature(REF_DBL *metric,REF_GRID ref_grid)

{
  double dVar1;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  double dVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  REF_INT RVar7;
  long lVar8;
  REF_DBL *m;
  long lVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uint local_1cc;
  REF_DBL hmax;
  REF_DBL slop;
  REF_DBL hr;
  double local_1b0;
  REF_GRID local_1a8;
  REF_DBL kr;
  double local_198;
  REF_DBL delta_radian;
  REF_DBL hs;
  REF_DBL *local_180;
  REF_DBL r [3];
  REF_DBL crease_dot_prod;
  REF_DBL ks;
  REF_DBL s [3];
  REF_DBL n [3];
  double local_f8;
  double local_f0;
  double local_e8;
  REF_DBL local_e0;
  REF_DBL RStack_d8;
  REF_DBL local_d0;
  REF_DBL local_c8;
  REF_DBL RStack_c0;
  REF_DBL local_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  REF_DBL previous_metric [6];
  REF_DBL curvature_metric [6];
  
  ref_node = ref_grid->node;
  ref_geom = ref_grid->geom;
  hmax = 1e+200;
  local_1a8 = ref_grid;
  if (ref_geom->model == (void *)0x0) {
    if (ref_geom->meshlink == (void *)0x0) {
      puts("\nNo geometry model, did you forget to load it?\n");
      pcVar12 = "...or implement non-CAD curvature estimate";
      local_1cc = 6;
      uVar5 = 0x53b;
      uVar11 = 6;
      goto LAB_001d6c04;
    }
    local_1cc = ref_node_bounding_box_diagonal(ref_node,&hmax);
    if (local_1cc == 0) goto LAB_001d5dce;
    pcVar12 = "bbox diag";
    uVar5 = 0x538;
  }
  else {
    local_1cc = ref_egads_diagonal(ref_geom,-1,&hmax);
    if (local_1cc == 0) {
LAB_001d5dce:
      uVar15 = 0;
      uVar16 = 0x3ff00000;
      dVar1 = ref_geom->segments_per_bounding_box_diagonal;
      if (1.0 <= dVar1) {
        uVar15 = SUB84(dVar1,0);
        uVar16 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      hmax = hmax / (double)CONCAT44(uVar16,uVar15);
      local_180 = metric;
      if (0 < ref_node->max) {
        lVar8 = 0;
        do {
          if ((-1 < ref_node->global[lVar8]) && (ref_node->ref_mpi->id == ref_node->part[lVar8])) {
            if (ref_geom->model == (void *)0x0) {
              dVar1 = (1.0 / hmax) / hmax;
              *metric = dVar1;
              metric[1] = 0.0;
              metric[2] = 0.0;
              metric[3] = dVar1;
              metric[4] = 0.0;
              metric[5] = dVar1;
            }
            else {
              uVar4 = ref_egads_feature_size(local_1a8,(REF_INT)lVar8,&hr,r,&hs,s,&local_1b0,n);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x54b,"ref_metric_from_curvature",(ulong)uVar4,"feature size");
                return uVar4;
              }
              local_f8 = (1.0 / hr) / hr;
              if (hr * 20.0 <= hs) {
                hs = hr * 20.0;
              }
              if (hr + hr <= local_1b0) {
                local_1b0 = hr + hr;
              }
              local_f0 = (1.0 / hs) / hs;
              if (hs + hs <= local_1b0) {
                local_1b0 = hs + hs;
              }
              local_d0 = r[2];
              local_e0 = r[0];
              RStack_d8 = r[1];
              local_b8 = s[2];
              local_c8 = s[0];
              RStack_c0 = s[1];
              local_a0 = n[2];
              local_b0 = n[0];
              dStack_a8 = n[1];
              local_e8 = (1.0 / local_1b0) / local_1b0;
              uVar4 = ref_matrix_form_m(&local_f8,metric);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x555,"ref_metric_from_curvature",(ulong)uVar4,"form m");
                return uVar4;
              }
            }
          }
          lVar8 = lVar8 + 1;
          metric = metric + 6;
        } while (lVar8 < ref_node->max);
      }
      if (0 < ref_geom->max) {
        lVar13 = 0;
        lVar8 = 0;
        do {
          pRVar2 = ref_geom->descr;
          if (*(int *)((long)pRVar2 + lVar13) == 2) {
            iVar6 = *(int *)((long)pRVar2 + lVar13 + 0x14);
            lVar9 = (long)iVar6;
            if (ref_node->ref_mpi->id == ref_node->part[lVar9]) {
              local_198 = (double)(ulong)*(uint *)((long)pRVar2 + lVar13 + 4);
              RVar7 = (REF_INT)lVar8;
              uVar4 = ref_geom_radian_request(ref_geom,RVar7,&delta_radian);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x565,"ref_metric_from_curvature",(ulong)uVar4,"drad");
                return uVar4;
              }
              dVar1 = hmax / delta_radian;
              if (ref_geom->model == (void *)0x0) {
                if (ref_geom->meshlink == (void *)0x0) goto LAB_001d6611;
                uVar4 = ref_meshlink_face_curvature(local_1a8,RVar7,&kr,r,&ks,s);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x56c,"ref_metric_from_curvature",(ulong)uVar4,"curve");
                  return uVar4;
                }
              }
              else {
                uVar4 = ref_egads_face_curvature(ref_geom,RVar7,&kr,r,&ks,s);
                if (1 < uVar4) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x569,"ref_metric_from_curvature",(ulong)uVar4,"curve");
                  return uVar4;
                }
              }
              if (kr <= -kr) {
                kr = -kr;
              }
              uVar15 = (int)((ulong)ks >> 0x20);
              if (ks <= -ks) {
                uVar15 = (int)((ulong)-ks >> 0x20);
              }
              uVar16 = SUB84(ks,0);
              ks = (REF_DBL)CONCAT44(uVar15,uVar16);
              dVar3 = ks * 0.05;
              if (kr <= dVar3) {
                kr = dVar3;
              }
              if ((double)CONCAT44(uVar15,uVar16) <= kr * 0.05) {
                ks = kr * 0.05;
              }
              hr = hmax;
              dVar1 = 1.0 / dVar1;
              if (dVar1 < kr) {
                hr = delta_radian / kr;
              }
              hs = hmax;
              iVar10 = SUB84(local_198,0);
              if (dVar1 < ks) {
                hs = delta_radian / ks;
              }
              if (ref_geom->model == (void *)0x0) {
                if (ref_geom->meshlink == (void *)0x0) {
                  slop = hmax * 1e-05;
                }
                else {
                  uVar4 = ref_meshlink_gap(local_1a8,iVar6,&slop);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x581,"ref_metric_from_curvature",(ulong)uVar4,"edge tol");
                    return uVar4;
                  }
                  slop = ref_geom->gap_protection * slop;
                  iVar10 = SUB84(local_198,0);
                }
LAB_001d63b8:
                if ((hr < slop) || (hs < slop)) goto LAB_001d6611;
                dVar1 = hmax;
                if ((0 < iVar10) && (dVar1 = hmax, iVar10 <= ref_geom->nface)) {
                  if (((ref_geom->face_min_length != (REF_DBL *)0x0) &&
                      (dVar1 = ref_geom->face_min_length[iVar10 - 1U], 0.0 < dVar1)) &&
                     ((hr < dVar1 || (hs < dVar1)))) goto LAB_001d6611;
                  local_1b0 = hmax;
                  dVar1 = local_1b0;
                  if (((iVar10 <= ref_geom->nface) &&
                      (ref_geom->initial_cell_height != (REF_DBL *)0x0)) &&
                     (dVar1 = ref_geom->initial_cell_height[iVar10 - 1U], dVar1 <= 0.0)) {
                    dVar1 = local_1b0;
                  }
                }
                local_1b0 = dVar1;
                if (hr + hr <= local_1b0) {
                  local_1b0 = hr + hr;
                }
                if (hs + hs <= local_1b0) {
                  local_1b0 = hs + hs;
                }
                n[0] = r[1] * s[2] - s[1] * r[2];
                n[1] = r[2] * s[0] - s[2] * r[0];
                n[2] = r[0] * s[1] - s[0] * r[1];
                local_d0 = r[2];
                local_e0 = r[0];
                RStack_d8 = r[1];
                local_f8 = (1.0 / hr) / hr;
                local_b8 = s[2];
                local_c8 = s[0];
                RStack_c0 = s[1];
                local_f0 = (1.0 / hs) / hs;
                local_e8 = (1.0 / local_1b0) / local_1b0;
                local_b0 = n[0];
                dStack_a8 = n[1];
                local_a0 = n[2];
                uVar4 = ref_matrix_form_m(&local_f8,curvature_metric);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x59c,"ref_metric_from_curvature",(ulong)uVar4,"reform m");
                  return uVar4;
                }
                previous_metric[0] = local_180[lVar9 * 6];
                previous_metric[1] = (local_180 + lVar9 * 6)[1];
                previous_metric[2] = local_180[lVar9 * 6 + 2];
                previous_metric[3] = (local_180 + lVar9 * 6 + 2)[1];
                previous_metric[4] = local_180[lVar9 * 6 + 4];
                previous_metric[5] = (local_180 + lVar9 * 6 + 4)[1];
                uVar4 = ref_matrix_intersect(previous_metric,curvature_metric,local_180 + lVar9 * 6)
                ;
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x5a0,"ref_metric_from_curvature",(ulong)uVar4,
                         "intersect to update metric");
                  local_1cc = uVar4;
                }
                bVar14 = uVar4 == 0;
              }
              else {
                uVar4 = ref_geom_usable(ref_geom,RVar7,(REF_BOOL *)&crease_dot_prod);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x57d,"ref_metric_from_curvature",(ulong)uVar4,"useable curvature");
                  local_1cc = uVar4;
                }
                iVar6 = 1;
                if (uVar4 == 0) {
                  if (crease_dot_prod._0_4_ == 0) {
                    iVar6 = 0x10;
                  }
                  else {
                    uVar4 = ref_geom_reliability(ref_geom,RVar7,&slop);
                    if (uVar4 == 0) {
                      iVar6 = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x57f,"ref_metric_from_curvature",(ulong)uVar4,"edge tol");
                      local_1cc = uVar4;
                    }
                  }
                }
                iVar10 = SUB84(local_198,0);
                if (iVar6 == 0) goto LAB_001d63b8;
                bVar14 = iVar6 == 0x10;
              }
              if (!bVar14) {
                return local_1cc;
              }
            }
          }
LAB_001d6611:
          lVar8 = lVar8 + 1;
          lVar13 = lVar13 + 0x18;
        } while (lVar8 < ref_geom->max);
      }
      if (0 < ref_geom->max) {
        lVar13 = 0;
        lVar8 = 0;
        do {
          if (*(int *)((long)ref_geom->descr + lVar13) == 1) {
            iVar6 = *(int *)((long)ref_geom->descr + lVar13 + 0x14);
            lVar9 = (long)iVar6;
            if (ref_node->ref_mpi->id == ref_node->part[lVar9]) {
              RVar7 = (REF_INT)lVar8;
              uVar4 = ref_geom_radian_request(ref_geom,RVar7,&delta_radian);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x5a7,"ref_metric_from_curvature",(ulong)uVar4,"drad");
                return uVar4;
              }
              if (ref_geom->model == (void *)0x0) {
                if (ref_geom->meshlink == (void *)0x0) goto LAB_001d6b18;
                local_198 = hmax / delta_radian;
                uVar4 = ref_meshlink_edge_curvature(local_1a8,RVar7,&kr,r);
                uVar11 = (ulong)uVar4;
                if (uVar4 != 0) {
                  uVar5 = 0x5ac;
                  goto LAB_001d67b6;
                }
              }
              else {
                local_198 = hmax / delta_radian;
                uVar4 = ref_egads_edge_curvature(ref_geom,RVar7,&kr,r);
                uVar11 = (ulong)uVar4;
                if (uVar4 != 0) {
                  uVar5 = 0x5aa;
LAB_001d67b6:
                  local_1cc = (uint)uVar11;
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,uVar5,"ref_metric_from_curvature",uVar11,"curve");
                }
              }
              if ((int)uVar11 != 0) {
                return local_1cc;
              }
              uVar15 = (undefined4)((ulong)kr >> 0x20);
              if (kr <= -kr) {
                uVar15 = (undefined4)((ulong)-kr >> 0x20);
              }
              uVar16 = SUB84(kr,0);
              kr = (REF_DBL)CONCAT44(uVar15,uVar16);
              hr = hmax;
              if (1.0 / local_198 <= (double)CONCAT44(uVar15,uVar16) &&
                  (double)CONCAT44(uVar15,uVar16) != 1.0 / local_198) {
                hr = delta_radian / (double)CONCAT44(uVar15,uVar16);
              }
              if (ref_geom->model == (void *)0x0) {
                if (ref_geom->meshlink == (void *)0x0) {
                  slop = hmax * 1e-05;
                }
                else {
                  uVar4 = ref_meshlink_gap(local_1a8,iVar6,&slop);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x5b8,"ref_metric_from_curvature",(ulong)uVar4,"edge tol");
                    return uVar4;
                  }
                  slop = ref_geom->gap_protection * slop;
                }
              }
              else {
                uVar4 = ref_geom_reliability(ref_geom,RVar7,&slop);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x5b6,"ref_metric_from_curvature",(ulong)uVar4,"edge tol");
                  return uVar4;
                }
              }
              if (slop <= hr) {
                if (ref_geom->model != (void *)0x0) {
                  uVar4 = ref_geom_crease(local_1a8,iVar6,&crease_dot_prod);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x5c0,"ref_metric_from_curvature",(ulong)uVar4,"crease");
                    return uVar4;
                  }
                  if ((double)CONCAT44(crease_dot_prod._4_4_,crease_dot_prod._0_4_) < -0.8) {
                    dVar1 = (-0.8 - (double)CONCAT44(crease_dot_prod._4_4_,crease_dot_prod._0_4_)) /
                            0.2;
                    hr = (dVar1 * 0.25 + (1.0 - dVar1)) * hr;
                  }
                }
                local_e0 = 1.0;
                RStack_d8 = 0.0;
                local_d0 = 0.0;
                local_f8 = (1.0 / hr) / hr;
                local_c8 = 0.0;
                RStack_c0 = 1.0;
                local_b8 = 0.0;
                local_b0 = 0.0;
                dStack_a8 = 0.0;
                local_a0 = 1.0;
                local_f0 = local_f8;
                local_e8 = local_f8;
                uVar4 = ref_matrix_form_m(&local_f8,curvature_metric);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x5d8,"ref_metric_from_curvature",(ulong)uVar4,"reform m");
                  return uVar4;
                }
                previous_metric[0] = local_180[lVar9 * 6];
                previous_metric[1] = (local_180 + lVar9 * 6)[1];
                previous_metric[2] = local_180[lVar9 * 6 + 2];
                previous_metric[3] = (local_180 + lVar9 * 6 + 2)[1];
                previous_metric[4] = local_180[lVar9 * 6 + 4];
                previous_metric[5] = (local_180 + lVar9 * 6 + 4)[1];
                uVar4 = ref_matrix_intersect(previous_metric,curvature_metric,local_180 + lVar9 * 6)
                ;
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x5dc,"ref_metric_from_curvature",(ulong)uVar4,
                         "intersect to update metric");
                  return uVar4;
                }
              }
            }
          }
LAB_001d6b18:
          lVar8 = lVar8 + 1;
          lVar13 = lVar13 + 0x18;
        } while (lVar8 < ref_geom->max);
      }
      if ((local_1a8->twod != 0) && (0 < ref_node->max)) {
        lVar8 = 0;
        m = local_180;
        do {
          if (((-1 < ref_node->global[lVar8]) && (ref_node->ref_mpi->id == ref_node->part[lVar8]))
             && (uVar4 = ref_matrix_twod_m(m), uVar4 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x5e3,"ref_metric_from_curvature",(ulong)uVar4,"enforce twod");
            return uVar4;
          }
          lVar8 = lVar8 + 1;
          m = m + 6;
        } while (lVar8 < ref_node->max);
      }
      local_1cc = ref_node_ghost_dbl(ref_node,local_180,6);
      if (local_1cc == 0) {
        return 0;
      }
      pcVar12 = "update ghosts";
      uVar5 = 0x5e8;
    }
    else {
      pcVar12 = "egads bbox diag";
      uVar5 = 0x536;
    }
  }
  uVar11 = (ulong)local_1cc;
LAB_001d6c04:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar5,
         "ref_metric_from_curvature",uVar11,pcVar12);
  return local_1cc;
}

Assistant:

REF_FCN REF_STATUS ref_metric_from_curvature(REF_DBL *metric,
                                             REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom, node, face;
  REF_DBL kr, r[3], ks, s[3], n[3];
  REF_DBL diagonal_system[12];
  REF_DBL previous_metric[6], curvature_metric[6];
  REF_INT i;
  REF_DBL delta_radian; /* 1/segments per radian */
  REF_DBL hmax = REF_DBL_MAX;
  REF_DBL rlimit;
  REF_DBL hr, hs, hn, slop;
  REF_DBL aspect_ratio, curvature_ratio, norm_ratio;
  REF_DBL crease_dot_prod, ramp, scale;

  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_diagonal(ref_geom, REF_EMPTY, &hmax), "egads bbox diag");
  } else if (ref_geom_meshlinked(ref_geom)) {
    RSS(ref_node_bounding_box_diagonal(ref_node, &hmax), "bbox diag");
  } else {
    printf("\nNo geometry model, did you forget to load it?\n\n");
    RSS(REF_IMPLEMENT, "...or implement non-CAD curvature estimate");
  }
  /* normal spacing and max tangential spacing */
  hmax /= MAX(1.0, ref_geom_segments_per_bounding_box_diagonal(ref_geom));

  /* limit aspect ratio via curvature */
  aspect_ratio = 20.0;
  curvature_ratio = 1.0 / aspect_ratio;

  /* limit normal direction to a factor of surface spacing */
  norm_ratio = 2.0;

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_egads_feature_size(ref_grid, node, &hr, r, &hs, s, &hn, n),
            "feature size");
        hs = MIN(hs, hr * aspect_ratio);
        hn = MIN(hn, norm_ratio * hr);
        hn = MIN(hn, norm_ratio * hs);
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 0) = r[i];
        ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 1) = s[i];
        ref_matrix_eig(diagonal_system, 1) = 1.0 / hs / hs;
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 2) = n[i];
        ref_matrix_eig(diagonal_system, 2) = 1.0 / hn / hn;
        RSS(ref_matrix_form_m(diagonal_system, &(metric[6 * node])), "form m");
      } else {
        metric[0 + 6 * node] = 1.0 / hmax / hmax;
        metric[1 + 6 * node] = 0.0;
        metric[2 + 6 * node] = 0.0;
        metric[3 + 6 * node] = 1.0 / hmax / hmax;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0 / hmax / hmax;
      }
    }
  }

  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_node_owned(ref_node, node)) {
      face = ref_geom_id(ref_geom, geom) - 1;
      RSS(ref_geom_radian_request(ref_geom, geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      if (ref_geom_model_loaded(ref_geom)) {
        RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s),
            REF_FAILURE, "curve");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_face_curvature(ref_grid, geom, &kr, r, &ks, s),
            "curve");
      } else {
        continue;
      }
      /* ignore sign, curvature is 1 / radius */
      kr = ABS(kr);
      ks = ABS(ks);
      /* limit the aspect ratio of the metric by reducing the largest radius */
      kr = MAX(kr, curvature_ratio * ks);
      ks = MAX(ks, curvature_ratio * kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;
      hs = hmax;
      if (1.0 / rlimit < ks) hs = delta_radian / ks;

      if (ref_geom_model_loaded(ref_geom)) {
        REF_BOOL usable;
        RSS(ref_geom_usable(ref_geom, geom, &usable), "useable curvature");
        if (!usable) continue;
        RSS(ref_geom_reliability(ref_geom, geom, &slop), "edge tol");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_gap(ref_grid, node, &slop), "edge tol");
        slop *= ref_geom_gap_protection(ref_geom);
      } else {
        slop = 1.0e-5 * hmax;
      }
      if (hr < slop || hs < slop) continue;
      if (0.0 < ref_geom_face_min_length(ref_geom, face)) {
        if (hr < ref_geom_face_min_length(ref_geom, face) ||
            hs < ref_geom_face_min_length(ref_geom, face))
          continue;
      }

      hn = hmax;
      if (0.0 < ref_geom_face_initial_cell_height(ref_geom, face))
        hn = ref_geom_face_initial_cell_height(ref_geom, face);
      hn = MIN(hn, norm_ratio * hr);
      hn = MIN(hn, norm_ratio * hs);

      /* cross the tangent vectors to get the (inward or outward) normal */
      ref_math_cross_product(r, s, n);
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 0) = r[i];
      ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 1) = s[i];
      ref_matrix_eig(diagonal_system, 1) = 1.0 / hs / hs;
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 2) = n[i];
      ref_matrix_eig(diagonal_system, 2) = 1.0 / hn / hn;
      /* form and intersect with previous */
      RSS(ref_matrix_form_m(diagonal_system, curvature_metric), "reform m");
      for (i = 0; i < 6; i++) previous_metric[i] = metric[i + 6 * node];
      RSS(ref_matrix_intersect(previous_metric, curvature_metric,
                               &(metric[6 * node])),
          "intersect to update metric");
    }
  }

  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_geom_radian_request(ref_geom, geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_egads_edge_curvature(ref_geom, geom, &kr, r), "curve");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_edge_curvature(ref_grid, geom, &kr, r), "curve");
      } else {
        continue;
      }
      /* ignore sign, curvature is 1 / radius */
      kr = ABS(kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;

      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_geom_reliability(ref_geom, geom, &slop), "edge tol");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_gap(ref_grid, node, &slop), "edge tol");
        slop *= ref_geom_gap_protection(ref_geom);
      } else {
        slop = 1.0e-5 * hmax;
      }
      if (hr < slop) continue;

      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_geom_crease(ref_grid, node, &crease_dot_prod), "crease");
        if (crease_dot_prod < -0.8) {
          ramp = (-crease_dot_prod - 0.8) / 0.2;
          scale = 0.25 * ramp + 1.0 * (1.0 - ramp);
          hr *= scale;
        }
      }

      ref_matrix_vec(diagonal_system, 0, 0) = 1.0;
      ref_matrix_vec(diagonal_system, 1, 0) = 0.0;
      ref_matrix_vec(diagonal_system, 2, 0) = 0.0;
      ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;

      ref_matrix_vec(diagonal_system, 0, 1) = 0.0;
      ref_matrix_vec(diagonal_system, 1, 1) = 1.0;
      ref_matrix_vec(diagonal_system, 2, 1) = 0.0;
      ref_matrix_eig(diagonal_system, 1) = 1.0 / hr / hr;

      ref_matrix_vec(diagonal_system, 0, 2) = 0.0;
      ref_matrix_vec(diagonal_system, 1, 2) = 0.0;
      ref_matrix_vec(diagonal_system, 2, 2) = 1.0;
      ref_matrix_eig(diagonal_system, 2) = 1.0 / hr / hr;

      /* form and intersect with previous */
      RSS(ref_matrix_form_m(diagonal_system, curvature_metric), "reform m");
      for (i = 0; i < 6; i++) previous_metric[i] = metric[i + 6 * node];
      RSS(ref_matrix_intersect(previous_metric, curvature_metric,
                               &(metric[6 * node])),
          "intersect to update metric");
    }
  }

  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        RSS(ref_matrix_twod_m(&(metric[6 * node])), "enforce twod");
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}